

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covec.hpp
# Opt level: O0

void __thiscall
covec::Covec<float>::
accumulate_grad<std::vector<std::pair<unsigned_long,std::vector<float,std::allocator<float>>>,std::allocator<std::pair<unsigned_long,std::vector<float,std::allocator<float>>>>>>
          (Covec<float> *this,
          vector<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>_>_>
          *grad,vector<unsigned_long,_std::allocator<unsigned_long>_> *sample,POS_NEG pos_neg,
          size_t K)

{
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> __last;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> __first;
  size_t sVar1;
  const_reference pvVar2;
  element_type *peVar3;
  reference pvVar4;
  element_type *peVar5;
  reference pvVar6;
  const_reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  vector<float,_std::allocator<float>_> *this_00;
  int in_ECX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDX;
  vector<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>_>_>
  *in_RSI;
  Covec<float> *in_RDI;
  __shared_ptr_access<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_R8;
  float fVar10;
  float fVar11;
  double dVar12;
  size_t k_2;
  size_t k_1;
  float C;
  float eta;
  vector<float,_std::allocator<float>_> *g;
  value_type *grad_i;
  value_type *v_1;
  value_type *cs_ij;
  value_type *j_1;
  size_t I_1;
  size_t i_1;
  float coeff;
  float sigmoid;
  float inner_product;
  size_t k;
  value_type *v;
  value_type j;
  size_t I;
  size_t i;
  vector<float,_std::allocator<float>_> Hadamard_product;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffeb8;
  __shared_ptr_access<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  float in_stack_fffffffffffffed0;
  float in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffee0;
  __shared_ptr_access<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *local_f0;
  __shared_ptr_access<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *local_e8;
  size_type local_a8;
  size_t in_stack_ffffffffffffff70;
  POS_NEG in_stack_ffffffffffffff7c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff80;
  __shared_ptr_access<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *p_Var13;
  vector<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>_>_>
  *in_stack_ffffffffffffff88;
  Covec<float> *in_stack_ffffffffffffff90;
  value_type __n;
  size_type local_60;
  vector<float,_std::allocator<float>_> local_40;
  __shared_ptr_access<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *local_28;
  int local_1c;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_18;
  vector<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>_>_>
  *local_10;
  
  local_28 = in_R8;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  sVar1 = order((Covec<float> *)0x15d440);
  if (sVar1 == 2) {
    accumulate_grad_2<std::vector<std::pair<unsigned_long,std::vector<float,std::allocator<float>>>,std::allocator<std::pair<unsigned_long,std::vector<float,std::allocator<float>>>>>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff7c,in_stack_ffffffffffffff70);
  }
  else {
    dimension(in_RDI);
    std::allocator<float>::allocator((allocator<float> *)0x15d4a0);
    std::vector<float,_std::allocator<float>_>::vector
              (in_stack_fffffffffffffee0,
               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
               (value_type_conflict2 *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0)
               ,(allocator_type *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    std::allocator<float>::~allocator((allocator<float> *)0x15d4ce);
    local_60 = 0;
    sVar1 = order((Covec<float> *)0x15d4e4);
    for (; local_60 < sVar1; local_60 = local_60 + 1) {
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (local_18,local_60);
      __n = *pvVar2;
      std::
      vector<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
      ::operator[](&in_RDI->cs_,local_60);
      peVar3 = std::
               __shared_ptr_access<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*(in_stack_fffffffffffffec0);
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](peVar3,__n);
      *pvVar4 = *pvVar4 + 1;
      std::
      vector<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>_>
      ::operator[](&in_RDI->vs_,local_60);
      peVar5 = std::
               __shared_ptr_access<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)in_stack_fffffffffffffec0);
      pvVar6 = std::
               vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ::operator[](peVar5,__n);
      for (p_Var13 = (__shared_ptr_access<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x0; p_Var13 < local_28; p_Var13 = p_Var13 + 1) {
        pvVar7 = std::vector<float,_std::allocator<float>_>::operator[](pvVar6,(size_type)p_Var13);
        fVar10 = *pvVar7;
        pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                           (&local_40,(size_type)p_Var13);
        *pvVar8 = fVar10 * *pvVar8;
      }
    }
    std::vector<float,_std::allocator<float>_>::begin(in_stack_fffffffffffffeb8);
    std::vector<float,_std::allocator<float>_>::end(in_stack_fffffffffffffeb8);
    __first._M_current._4_4_ = in_stack_fffffffffffffed4;
    __first._M_current._0_4_ = in_stack_fffffffffffffed0;
    __last._M_current._4_4_ = in_stack_fffffffffffffecc;
    __last._M_current._0_4_ = in_stack_fffffffffffffec8;
    dVar12 = std::
             accumulate<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,double>
                       (__first,__last,(double)in_stack_fffffffffffffec0);
    dVar12 = std::exp((double)((ulong)(uint)(float)dVar12 ^ 0x8000000080000000));
    fVar10 = 1.0 / (SUB84(dVar12,0) + 1.0);
    if (local_1c == 0) {
      fVar10 = 1.0 - fVar10;
    }
    else {
      fVar10 = -fVar10;
    }
    local_a8 = 0;
    sVar1 = order((Covec<float> *)0x15d75d);
    for (; local_a8 < sVar1; local_a8 = local_a8 + 1) {
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (local_18,local_a8);
      std::
      vector<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
      ::operator[](&in_RDI->cs_,local_a8);
      peVar3 = std::
               __shared_ptr_access<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*(in_stack_fffffffffffffec0);
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (peVar3,*pvVar2);
      *pvVar4 = *pvVar4 + 1;
      std::
      vector<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>_>
      ::operator[](&in_RDI->vs_,local_a8);
      peVar5 = std::
               __shared_ptr_access<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)in_stack_fffffffffffffec0);
      pvVar6 = std::
               vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               ::operator[](peVar5,*pvVar2);
      pvVar9 = std::
               vector<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<unsigned_long,_std::vector<float,_std::allocator<float>_>_>_>_>
               ::operator[](local_10,local_a8);
      pvVar9->first = *pvVar2;
      this_00 = &pvVar9->second;
      in_stack_fffffffffffffed4 = next_eta(in_RDI,*pvVar4);
      fVar11 = fVar10 * in_stack_fffffffffffffed4;
      for (local_e8 = (__shared_ptr_access<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x0; local_f0 = local_28, local_e8 < local_28; local_e8 = local_e8 + 1) {
        pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                           (&local_40,(size_type)local_e8);
        if ((*pvVar8 != 0.0) || (NAN(*pvVar8))) {
          in_stack_fffffffffffffed0 = fVar11;
          pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                             (&local_40,(size_type)local_e8);
          in_stack_fffffffffffffed0 = in_stack_fffffffffffffed0 * *pvVar8;
          pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                             (pvVar6,(size_type)local_e8);
          in_stack_fffffffffffffed0 = in_stack_fffffffffffffed0 / *pvVar7;
          pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                             (this_00,(size_type)local_e8);
          *pvVar8 = in_stack_fffffffffffffed0;
        }
        else {
          pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                             (this_00,(size_type)local_e8);
          *pvVar8 = 0.0;
        }
      }
      while( true ) {
        local_f0 = local_f0 + 1;
        in_stack_fffffffffffffec0 = local_f0;
        p_Var13 = (__shared_ptr_access<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)dimension(in_RDI);
        if (p_Var13 <= in_stack_fffffffffffffec0) break;
        pvVar8 = std::vector<float,_std::allocator<float>_>::operator[](this_00,(size_type)local_f0)
        ;
        *pvVar8 = 0.0;
      }
    }
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)
               CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  }
  return;
}

Assistant:

void Covec<Real>::accumulate_grad(Grad& grad
                                    , const std::vector<std::size_t>& sample
                                    , const typename Covec::POS_NEG pos_neg
				    , const std::size_t K)
  {
    assert( sample.size() == this->order() );

    if( this->order() == 2 ){
      return accumulate_grad_2(grad, sample, pos_neg, K);
    }

    // count the occurences and
    // compute Hadamard product, inner_product, sigmoid of inner_product
    std::vector<Real> Hadamard_product(this->dimension(), 1.0);
    for(std::size_t i = 0, I = this->order(); i < I; ++i){
      const auto j = sample[i];
      ++(*this->cs_[i])[j];
      const auto& v = (*this->vs_[i])[j];
      assert( v.size() == this->dimension() );
      for(std::size_t k = 0; k < K; ++k){
        Hadamard_product[k] *= v[k];
      }
    }
    Real inner_product =
      static_cast<Real>(std::accumulate(Hadamard_product.begin(), Hadamard_product.end(), 0.0));
    Real sigmoid = static_cast<Real>( 1.0 / ( 1 + std::exp(-inner_product) ) );
    Real coeff = (pos_neg == POSITIVE ? 1 - sigmoid : -sigmoid);

    // compute gradients
    for(std::size_t i = 0, I = this->order(); i < I; ++i){
      const auto& j = sample[i];
      auto& cs_ij = (*this->cs_[i])[j];
      ++cs_ij;
      const auto& v = (*this->vs_[i])[j];
      auto& grad_i = grad[i];
      grad_i.first = j;
      auto& g = grad_i.second;
      auto eta = this->next_eta(cs_ij);
      const auto C = coeff * eta;
      for(std::size_t k = 0; k < K; ++k){
        if( Hadamard_product[k] == 0 ){
	  g[k] = 0;
	  continue;
	}
        g[k] = C * Hadamard_product[k] / v[k];
      }
      for(std::size_t k = K + 1; k < this->dimension(); ++k){
	g[k] = 0;
      }
    }

  }